

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

uint64_t read_uint64(dwarf_buf *buf)

{
  int iVar1;
  uint64_t uVar2;
  ulong uVar3;
  byte *pbVar4;
  
  pbVar4 = buf->buf;
  iVar1 = advance(buf,8);
  if (iVar1 == 0) {
    uVar2 = 0;
  }
  else {
    if (buf->is_bigendian == 0) {
      uVar3 = (ulong)pbVar4[1] << 8 |
              (ulong)pbVar4[2] << 0x10 |
              (ulong)pbVar4[3] << 0x18 |
              (ulong)pbVar4[4] << 0x20 |
              (ulong)pbVar4[5] << 0x28 | (ulong)pbVar4[6] << 0x30 | (ulong)pbVar4[7] << 0x38;
    }
    else {
      uVar3 = (ulong)pbVar4[6] << 8 |
              (ulong)pbVar4[5] << 0x10 |
              (ulong)pbVar4[4] << 0x18 |
              (ulong)pbVar4[3] << 0x20 |
              (ulong)pbVar4[2] << 0x28 | (ulong)pbVar4[1] << 0x30 | (ulong)*pbVar4 << 0x38;
      pbVar4 = pbVar4 + 7;
    }
    uVar2 = *pbVar4 | uVar3;
  }
  return uVar2;
}

Assistant:

static uint64_t
read_uint64 (struct dwarf_buf *buf)
{
  const unsigned char *p = buf->buf;

  if (!advance (buf, 8))
    return 0;
  if (buf->is_bigendian)
    return (((uint64_t) p[0] << 56) | ((uint64_t) p[1] << 48)
	    | ((uint64_t) p[2] << 40) | ((uint64_t) p[3] << 32)
	    | ((uint64_t) p[4] << 24) | ((uint64_t) p[5] << 16)
	    | ((uint64_t) p[6] << 8) | (uint64_t) p[7]);
  else
    return (((uint64_t) p[7] << 56) | ((uint64_t) p[6] << 48)
	    | ((uint64_t) p[5] << 40) | ((uint64_t) p[4] << 32)
	    | ((uint64_t) p[3] << 24) | ((uint64_t) p[2] << 16)
	    | ((uint64_t) p[1] << 8) | (uint64_t) p[0]);
}